

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature_parser.c
# Opt level: O1

uint8_t * apx_signatureParser_parse_limits_u32
                    (apx_signatureParser_t *self,uint8_t *begin,uint8_t *end)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint32_t upper_limit;
  uint32_t lower_limit;
  undefined8 local_28;
  
  if ((begin < end) && (*begin == '(')) {
    local_28 = begin;
    puVar1 = bstr_lstrip(begin + 1,end);
    if (((puVar1 < end) &&
        (((puVar2 = apx_parserBase_parse_u32(puVar1,end,(uint32_t *)((long)&local_28 + 4)),
          puVar1 < puVar2 && (puVar1 = bstr_lstrip(puVar2,end), puVar1 < end)) && (*puVar1 == ',')))
        ) && ((puVar1 = bstr_lstrip(puVar1 + 1,end), puVar1 < end &&
              (puVar2 = apx_parserBase_parse_u32(puVar1,end,(uint32_t *)&local_28), puVar1 < puVar2)
              ))) {
      apx_dataElement_set_limits_uint32(self->state->data_element,local_28._4_4_,(uint32_t)local_28)
      ;
      puVar1 = bstr_lstrip(puVar2,end);
      if (puVar1 < end) {
        if (*puVar1 != ')') {
          return (uint8_t *)0x0;
        }
        return puVar1 + 1;
      }
    }
    begin = (uint8_t *)0x0;
  }
  return begin;
}

Assistant:

static uint8_t const* apx_signatureParser_parse_limits_u32(apx_signatureParser_t* self, uint8_t const* begin, uint8_t const* end)
{
   uint8_t const* next = begin;
   if (next < end)
   {
      uint8_t const* result = NULL;
      if (*next++ != '(')
      {
         return begin; //This is not the beginning of a limit expression
      }
      next = bstr_lstrip(next, end);
      if (next >= end)
      {
         return NULL;
      }
      uint32_t lower_limit, upper_limit;
      result = apx_parserBase_parse_u32(next, end, &lower_limit);
      if (result > next)
      {
         next = result;
      }
      else
      {
         return NULL;
      }
      next = bstr_lstrip(next, end);
      if (next >= end)
      {
         return NULL;
      }
      if (*next++ != ',')
      {
         return NULL;
      }
      next = bstr_lstrip(next, end);
      if (next >= end)
      {
         return NULL;
      }
      result = apx_parserBase_parse_u32(next, end, &upper_limit);
      if (result > next)
      {
         next = result;
      }
      else
      {
         return NULL;
      }
      apx_dataElement_set_limits_uint32(self->state->data_element, lower_limit, upper_limit);
      next = bstr_lstrip(next, end);
      if (next >= end)
      {
         return NULL;
      }
      if (*next++ != ')')
      {
         return NULL;
      }
      return next;
   }
   return begin;
}